

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

void ptls_esni_dispose_context(ptls_esni_context_t *esni)

{
  ptls_key_exchange_context_t **__ptr;
  ptls_key_exchange_context_t **pppVar1;
  ptls_key_exchange_context_t *ppVar2;
  long lVar3;
  long lVar4;
  
  if (esni->key_exchanges != (ptls_key_exchange_context_t **)0x0) {
    __ptr = esni->key_exchanges;
    ppVar2 = *__ptr;
    if (ppVar2 != (ptls_key_exchange_context_t *)0x0) {
      lVar3 = 8;
      lVar4 = 0;
      pppVar1 = __ptr;
      do {
        (*ppVar2->on_exchange)(pppVar1,1,(ptls_iovec_t *)0x0,(ptls_iovec_t)ZEXT816(0));
        __ptr = esni->key_exchanges;
        pppVar1 = __ptr + lVar4 + 1;
        lVar4 = lVar4 + 1;
        ppVar2 = *(ptls_key_exchange_context_t **)((long)__ptr + lVar3);
        lVar3 = lVar3 + 8;
      } while (ppVar2 != (ptls_key_exchange_context_t *)0x0);
    }
    free(__ptr);
  }
  free(esni->cipher_suites);
  return;
}

Assistant:

void ptls_esni_dispose_context(ptls_esni_context_t *esni)
{
    size_t i;

    if (esni->key_exchanges != NULL) {
        for (i = 0; esni->key_exchanges[i] != NULL; ++i)
            esni->key_exchanges[i]->on_exchange(esni->key_exchanges + i, 1, NULL, ptls_iovec_init(NULL, 0));
        free(esni->key_exchanges);
    }
    free(esni->cipher_suites);
}